

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall t_dart_generator::init_generator(t_dart_generator *this)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ulong uVar5;
  allocator local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  int local_1c0;
  undefined1 local_1ba;
  allocator local_1b9;
  int r_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  int local_178;
  undefined1 local_172;
  allocator local_171;
  int r_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  int local_12c;
  undefined1 local_128 [4];
  int r_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string subdir;
  allocator local_a5 [13];
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [36];
  int local_14;
  t_dart_generator *ptStack_10;
  int r;
  t_dart_generator *this_local;
  
  ptStack_10 = this;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = mkdir(pcVar2,0x1ff);
  std::__cxx11::string::~string(local_38);
  local_14 = iVar1;
  if ((iVar1 == -1) && (piVar3 = __errno_location(), *piVar3 != 0x11)) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_98);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,pcVar2,local_a5);
    std::operator+(&local_58,&local_78,": ");
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    std::operator+(pbVar4,&local_58,pcVar2);
    __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    find_library_name_abi_cxx11_
              ((string *)((long)&subdir.field_2 + 8),this,
               (this->super_t_oop_generator).super_t_generator.program_);
    std::__cxx11::string::operator=
              ((string *)&this->library_name_,(string *)(subdir.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(subdir.field_2._M_local_buf + 8));
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])();
  std::operator+(&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,"/")
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 &local_108,&this->library_name_);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)local_128);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_12c = mkdir(pcVar2,0x1ff);
  if ((local_12c == -1) && (piVar3 = __errno_location(), *piVar3 != 0x11)) {
    local_172 = 1;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&r_2,pcVar2,&local_171);
    std::operator+(&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r_2,": ");
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    std::operator+(pbVar4,&local_150,pcVar2);
    local_172 = 0;
    __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::__cxx11::string::operator=((string *)&this->base_dir_,(string *)local_e8);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&this->src_dir_,(string *)&this->base_dir_);
  }
  else {
    std::__cxx11::string::operator+=((string *)local_e8,"/lib");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_178 = mkdir(pcVar2,0x1ff);
    if ((local_178 == -1) && (piVar3 = __errno_location(), *piVar3 != 0x11)) {
      local_1ba = 1;
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&r_3,pcVar2,&local_1b9);
      std::operator+(&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r_3,": ")
      ;
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      std::operator+(pbVar4,&local_198,pcVar2);
      local_1ba = 0;
      __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    std::__cxx11::string::operator+=((string *)local_e8,"/src");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_1c0 = mkdir(pcVar2,0x1ff);
    if ((local_1c0 == -1) && (piVar3 = __errno_location(), *piVar3 != 0x11)) {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_200,pcVar2,&local_201);
      std::operator+(&local_1e0,&local_200,": ");
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      std::operator+(pbVar4,&local_1e0,pcVar2);
      __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    std::__cxx11::string::operator=((string *)&this->src_dir_,(string *)local_e8);
  }
  std::__cxx11::string::~string((string *)local_e8);
  return;
}

Assistant:

void t_dart_generator::init_generator() {
  MKDIR(get_out_dir().c_str());

  if (library_name_.empty()) {
    library_name_ = find_library_name(program_);
  }

  string subdir = get_out_dir() + "/" + library_name_;
  MKDIR(subdir.c_str());
  base_dir_ = subdir;

  if (library_prefix_.empty()) {
    subdir += "/lib";
    MKDIR(subdir.c_str());
    subdir += "/src";
    MKDIR(subdir.c_str());
    src_dir_ = subdir;
  } else {
    src_dir_ = base_dir_;
  }
}